

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hann_window.hpp
# Opt level: O2

void __thiscall re::fft::hann_window<float,_1024L>::encache(hann_window<float,_1024L> *this)

{
  int i;
  long lVar1;
  float fVar2;
  
  for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 1) {
    fVar2 = (float)(int)lVar1 * 0.0009765625;
    fVar2 = cosf((fVar2 + fVar2) * 3.1415927);
    (this->cache)._M_elems[lVar1] = (1.0 - fVar2) * 0.5;
  }
  return;
}

Assistant:

void
    encache()
    noexcept
    {
        for (auto i = 0; i < N; ++i) {
            cache[i] = window_function(i);
        }
    }